

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O1

void TPZBuildMultiphysicsMesh::TransferFromMeshesT<double>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TPZFMatrix<double> *pTVar5;
  TPZFMatrix<double> *pTVar6;
  TPZConnect *pTVar7;
  int64_t iVar8;
  TPZSubCompMesh *this;
  long lVar9;
  long lVar10;
  int64_t iVar11;
  TPZCompEl **ppTVar12;
  TPZCompMesh *pTVar13;
  int iVar14;
  int64_t iVar15;
  long lVar16;
  int r;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_50;
  
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01a08a30;
  local_50.fStore = (pair<TPZCompMesh_*,_long> *)0x0;
  local_50.fNElements = 0;
  local_50.fNAlloc = 0;
  ComputeAtomicIndexes(MFMesh,&local_50);
  iVar11 = local_50.fNElements;
  pTVar5 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&MFMesh->fSolution);
  if (0 < iVar11) {
    iVar15 = 0;
    do {
      pTVar13 = local_50.fStore[iVar15].first;
      if (pTVar13 != (TPZCompMesh *)0x0) {
        pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar13->fSolution);
        pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(pTVar13->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                            local_50.fStore[iVar15].second);
        lVar9 = pTVar7->fSequenceNumber;
        if (lVar9 < 0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x14e);
        }
        iVar4 = (pTVar13->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)lVar9].dim;
        pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(MFMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,iVar15);
        lVar10 = pTVar7->fSequenceNumber;
        if (lVar10 < 0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x152);
        }
        if (0 < iVar4) {
          iVar14 = 0;
          do {
            iVar8 = TPZBlock::Index(&pTVar13->fBlock,lVar9,iVar14);
            dVar1 = pTVar6->fElem[iVar8];
            iVar8 = TPZBlock::Index(&MFMesh->fBlock,lVar10,iVar14);
            pTVar5->fElem[iVar8] = dVar1;
            iVar14 = iVar14 + 1;
          } while (iVar4 != iVar14);
        }
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != iVar11);
  }
  this = (TPZSubCompMesh *)__dynamic_cast(MFMesh,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0)
  ;
  if (this != (TPZSubCompMesh *)0x0) {
    lVar9 = (**(code **)(*(long *)&this->super_TPZCompMesh + 0x98))();
    pTVar5 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_((TPZSolutionMatrix *)(lVar9 + 0x370));
    iVar4 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x90))();
    if (0 < iVar4) {
      iVar14 = 0;
      do {
        lVar10 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xa0))
                           (&this->super_TPZCompEl,iVar14);
        iVar11 = TPZSubCompMesh::InternalIndex(this,lVar10);
        if (lVar10 == -1) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x169);
        }
        TPZSolutionMatrix::operator_cast_to_TPZFMatrix_((TPZSolutionMatrix *)(lVar9 + 0x370));
        pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                           ((TPZChunkVector<TPZConnect,_10> *)(lVar9 + 0x158),lVar10);
        lVar10 = pTVar7->fSequenceNumber;
        lVar16 = (long)(int)lVar10 * 0x10;
        iVar2 = *(int *)(*(long *)(lVar9 + 0x5f0) + 0xc + lVar16);
        pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                           (&(this->super_TPZCompMesh).fSolution);
        pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(this->super_TPZCompMesh).fConnectVec.
                             super_TPZChunkVector<TPZConnect,_10>,iVar11);
        iVar11 = pTVar7->fSequenceNumber;
        if (lVar10 < 0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x177);
        }
        if (0 < iVar2) {
          r = 0;
          do {
            iVar3 = *(int *)(*(long *)(lVar9 + 0x5f0) + 8 + lVar16);
            iVar15 = TPZBlock::Index(&(this->super_TPZCompMesh).fBlock,iVar11,r);
            pTVar5->fElem[iVar3 + r] = pTVar6->fElem[iVar15];
            r = r + 1;
          } while (iVar2 != r);
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 != iVar4);
    }
  }
  lVar9 = (MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar9) {
    lVar10 = 0;
    do {
      ppTVar12 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                           (&(MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar10);
      if (*ppTVar12 == (TPZCompEl *)0x0) {
        pTVar13 = (TPZCompMesh *)0x0;
      }
      else {
        pTVar13 = (TPZCompMesh *)
                  __dynamic_cast(*ppTVar12,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
      }
      if (pTVar13 != (TPZCompMesh *)0x0) {
        TransferFromMeshes(cmeshVec,pTVar13);
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01a08a30;
  if (local_50.fStore != (pair<TPZCompMesh_*,_long> *)0x0) {
    operator_delete__(local_50.fStore);
  }
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMeshesT(TPZVec<TPZCompMesh *> &cmeshVec,
                                                   TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        if(!atomic_mesh) continue;
		TPZBlock &block = atomic_mesh->Block();
        TPZFMatrix<TVar> &sol = atomic_mesh->Solution();
        TPZConnect &con = atomic_mesh->ConnectVec()[indexes[connect].second];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            auto getval = sol(block.Index(seqnum, idf));
            solMF(blockMF.Index(seqnumMF, idf)) = getval;
        }
	}
    
    
    // copy the solution of the submesh to father mesh
    if(1)
    {
        TPZSubCompMesh *msub = dynamic_cast<TPZSubCompMesh*>(MFMesh);
        if(msub){
            TPZCompMesh * fathermesh = msub->FatherMesh();
            //TODOCOMPLEX
            TPZFMatrix<TVar> &fathermeshSol = fathermesh->Solution();
            TPZCompEl *compel = dynamic_cast<TPZCompEl*>(msub);
            int nconnect = compel->NConnects();
            
            for(int ic=0; ic<nconnect ; ic++){
                
                int64_t fatherconIndex = compel->ConnectIndex(ic);
                int64_t submeshIndex = msub->InternalIndex(fatherconIndex);
                if(fatherconIndex == -1) DebugStop();
                //acessing the block on father mesh
                TPZBlock &blockfather = fathermesh->Block();
                TPZFMatrix<TVar> &solfather = fathermesh->Solution();
                
                TPZConnect &confather = fathermesh->ConnectVec()[fatherconIndex];
                int64_t seqnumfather = confather.SequenceNumber();
                int nblock = blockfather.Size(seqnumfather);
                //acessing the block on submesh
                TPZBlock &blocksub = msub->Block();
                TPZFMatrix<TVar> &solsub = ((TPZCompMesh *)(msub))->Solution();
                const TPZConnect &consub = msub->ConnectVec()[submeshIndex];
                const int64_t seqnumsub = consub.SequenceNumber();
                
                if(seqnumfather < 0) DebugStop();
                for(int idf=0 ; idf<nblock; idf++){
                    const int posfather = blockfather.Position(seqnumfather);
                    auto valsub = solsub(blocksub.Index(seqnumsub, idf));
                    fathermeshSol(posfather + idf) = valsub;
                }
            }
            
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMeshes(cmeshVec, sub);
        }
    }
}